

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

void usage(void)

{
  fflush(_stdout);
  fwrite("Usage: demmt [OPTION]\nDecodes binary trace files generated by Valgrind MMT. Reads standard input\nor file passed by -l.\n\n  -l file\tuse \"file\" as input (can be compressed by: xz, bzip2, gzip)\n  -q\t\tprint only the most important data (quiet); shortcut for:\n    \t\t-d all -e pb,shader,macro,tsc,tic,cp,classes=all,buffer-usage,\n    \t\tnvrm-class-desc\n  -m chipset\tset chipset version (default: auto-detect based on trace\n            \tcontent and file name (nvXX...))\n  -c 0/1\tdisable/enable colors (default: 1 if stdout is a terminal)\n  -g 0/1\t= -d/-e gpu-addr (default: 0)\n  -o 0/1\t= -d/-e ioctl-raw (default: 0)\n  -r 0/1\t= -d/-e macro-rt-verbose (default: 0)\n  -p 0/1\tdisable/enable pager (default: 1 if stdout is a terminal)\n  -i 0/1\tdisable/enable log indentation (default: 0)\n  -a\t\t= -d classes=all\n  -s file\tin response to sync markers in input file: flush the output\n         \tstream and reply by writing marker id to specified file (see:\n         \tscripts/mmiotrace/mmt-app-demmt-mmiotrace.sh)\n  -x 0/1/2\tdisable/enable loose/enable strict sandboxing (default: 2\n          \tif libseccomp is available)\n\n  -d msg_type1[,msg_type2[,msg_type3....]] - disable messages\n  -e msg_type1[,msg_type2[,msg_type3....]] - enable messages\n     message types:\n     - write - memory write\n     - read - memory read\n     - gpu-addr - gpu address\n     - mem = read,write\n     - pb - push buffer\n     - class=[all,0x...] - class decoder\n     - tsc - texture sampler control block\n     - tic - texture image control block\n     - vp - vertex program\n     - fp - fragment program\n     - gp - geometry program\n     - cp - compute program\n     - tep\n     - tcp\n     - shader = vp,fp,gp,tep,tcp\n     - macro-rt-verbose - verbose macro interpreter\n     - macro-rt - macro interpreter \n     - macro-dis - macro disasm\n     - macro = macro-rt,macro-dis\n     - sys_mmap\n     - sys_mmap_details - prot & flags\n     - sys_munmap\n     - sys_mremap\n     - sys_open\n     - sys_write\n     - sys = sys_mmap,sys_munmap,sys_mremap,sys_open,sys_write,ioctl-desc\n     - ioctl-raw - raw..." /* TRUNCATED STRING LITERAL */
         ,0xa50,1,_stderr);
  exit(1);
}

Assistant:

static void usage()
{
	fflush(stdout);
	fprintf(stderr, "Usage: demmt [OPTION]\n"
			"Decodes binary trace files generated by Valgrind MMT. Reads standard input\n"
			"or file passed by -l.\n\n"
			"  -l file\tuse \"file\" as input (can be compressed by: xz, bzip2, gzip)\n"
			"  -q\t\tprint only the most important data (quiet); shortcut for:\n"
			"    \t\t-d all -e pb,shader,macro,tsc,tic,cp,classes=all,buffer-usage,\n"
			"    \t\tnvrm-class-desc\n"
			"  -m chipset\tset chipset version (default: auto-detect based on trace\n"
			"            \tcontent and file name (nvXX...))\n"
			"  -c 0/1\tdisable/enable colors (default: 1 if stdout is a terminal)\n"
			"  -g 0/1\t= -d/-e gpu-addr (default: 0)\n"
			"  -o 0/1\t= -d/-e ioctl-raw (default: 0)\n"
			"  -r 0/1\t= -d/-e macro-rt-verbose (default: 0)\n"
			"  -p 0/1\tdisable/enable pager (default: 1 if stdout is a terminal)\n"
			"  -i 0/1\tdisable/enable log indentation (default: 0)\n"
			"  -a\t\t= -d classes=all\n"
			"  -s file\tin response to sync markers in input file: flush the output\n"
			"         \tstream and reply by writing marker id to specified file (see:\n"
			"         \tscripts/mmiotrace/mmt-app-demmt-mmiotrace.sh)\n"
			"  -x 0/1/2\tdisable/enable loose/enable strict sandboxing (default: 2\n"
			"          \tif libseccomp is available)\n"
			"\n"
			"  -d msg_type1[,msg_type2[,msg_type3....]] - disable messages\n"
			"  -e msg_type1[,msg_type2[,msg_type3....]] - enable messages\n"
			"     message types:\n"
			"     - write - memory write\n"
			"     - read - memory read\n"
			"     - gpu-addr - gpu address\n"
			"     - mem = read,write\n"
			"     - pb - push buffer\n"
			"     - class=[all,0x...] - class decoder\n"
			"     - tsc - texture sampler control block\n"
			"     - tic - texture image control block\n"
			"     - vp - vertex program\n"
			"     - fp - fragment program\n"
			"     - gp - geometry program\n"
			"     - cp - compute program\n"
			"     - tep\n"
			"     - tcp\n"
			"     - shader = vp,fp,gp,tep,tcp\n"
			"     - macro-rt-verbose - verbose macro interpreter\n"
			"     - macro-rt - macro interpreter \n"
			"     - macro-dis - macro disasm\n"
			"     - macro = macro-rt,macro-dis\n"
			"     - sys_mmap\n"
			"     - sys_mmap_details - prot & flags\n"
			"     - sys_munmap\n"
			"     - sys_mremap\n"
			"     - sys_open\n"
			"     - sys_write\n"
			"     - sys = sys_mmap,sys_munmap,sys_mremap,sys_open,sys_write,ioctl-desc\n"
			"     - ioctl-raw - raw ioctl data\n"
			"     - ioctl-desc - decoded ioctl\n"
			"     - ioctl = ioctl-raw,ioctl-desc\n"
			"     - nvrm-ioctl=[all,name] name=create,call,host_map,etc...\n"
			"     - nvrm-mthd=[all,0x...] - method call\n"
			"     - nvrm-handle-desc - handle description\n"
			"     - nvrm-class-desc - class description\n"
			"     - nvrm-unk-0-fields - unk zero fields\n"
			"     - nvrm-obj-tree - object tree after create and before destroy ioctls\n"
			"     - nvrm = nvrm-ioctl=all,nvrm-mthd=all,nvrm-handle-desc,nvrm-class-desc\n"
			"     - buffer-usage\n"
			"     - msg - textual valgrind message\n"
			"     - info - various informations\n"
			"     - all - everything above\n"
			"\n");
	exit(1);
}